

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void analyzeAggFuncArgs(AggInfo *pAggInfo,NameContext *pNC)

{
  long lVar1;
  NameContext *in_RSI;
  long in_RDI;
  Expr *pExpr;
  int i;
  NameContext *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  in_RSI->ncFlags = in_RSI->ncFlags | 0x20000;
  for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x30); iVar2 = iVar2 + 1) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x28) + (long)iVar2 * 0x20);
    sqlite3ExprAnalyzeAggList(in_RSI,(ExprList *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    if (*(long *)(lVar1 + 0x10) != 0) {
      sqlite3ExprAnalyzeAggList(in_RSI,(ExprList *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    }
    if ((*(uint *)(lVar1 + 4) & 0x1000000) != 0) {
      sqlite3ExprAnalyzeAggregates(in_stack_ffffffffffffffd8,(Expr *)0x1ef72d);
    }
  }
  in_RSI->ncFlags = in_RSI->ncFlags & 0xfffdffff;
  return;
}

Assistant:

static void analyzeAggFuncArgs(
  AggInfo *pAggInfo,
  NameContext *pNC
){
  int i;
  assert( pAggInfo!=0 );
  assert( pAggInfo->iFirstReg==0 );
  pNC->ncFlags |= NC_InAggFunc;
  for(i=0; i<pAggInfo->nFunc; i++){
    Expr *pExpr = pAggInfo->aFunc[i].pFExpr;
    assert( pExpr->op==TK_FUNCTION || pExpr->op==TK_AGG_FUNCTION );
    assert( ExprUseXList(pExpr) );
    sqlite3ExprAnalyzeAggList(pNC, pExpr->x.pList);
    if( pExpr->pLeft ){
      assert( pExpr->pLeft->op==TK_ORDER );
      assert( ExprUseXList(pExpr->pLeft) );
      sqlite3ExprAnalyzeAggList(pNC, pExpr->pLeft->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    assert( !IsWindowFunc(pExpr) );
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      sqlite3ExprAnalyzeAggregates(pNC, pExpr->y.pWin->pFilter);
    }
#endif
  }
  pNC->ncFlags &= ~NC_InAggFunc;
}